

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O3

Aig_Man_t * Saig_ManCreateIndMiter2(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  char *pcVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void *__ptr;
  Aig_Man_t *p;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  Aig_Obj_t *p1;
  
  sVar4 = (long)pAig->vObjs->nSize * 3;
  __ptr = calloc(sVar4,8);
  p = Aig_ManStart((int)sVar4);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p->pName = pcVar5;
  pcVar1 = pAig->pSpec;
  iVar11 = 0;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p->pSpec = pcVar5;
  pAVar7 = p->pConst1;
  lVar6 = (long)pAig->pConst1->Id;
  *(Aig_Obj_t **)((long)__ptr + lVar6 * 0x18) = pAVar7;
  *(Aig_Obj_t **)((long)__ptr + lVar6 * 0x18 + 8) = pAVar7;
  *(Aig_Obj_t **)((long)__ptr + lVar6 * 0x18 + 0x10) = pAVar7;
  iVar18 = pAig->nRegs;
  iVar15 = pAig->nObjs[2];
  do {
    if (iVar18 < iVar15) {
      lVar6 = 0;
      do {
        if (pAig->vCis->nSize <= lVar6) goto LAB_00625325;
        pvVar2 = pAig->vCis->pArray[lVar6];
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)__ptr + ((long)*(int *)((long)pvVar2 + 0x24) * 3 + (long)iVar11) * 8)
             = pAVar7;
        lVar6 = lVar6 + 1;
        iVar18 = pAig->nRegs;
        iVar15 = pAig->nObjs[2];
      } while (lVar6 < iVar15 - iVar18);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  uVar16 = iVar15 - iVar18;
  pVVar8 = pAig->vCis;
  if ((int)uVar16 < pVVar8->nSize) {
    uVar12 = (ulong)uVar16;
    do {
      if ((int)uVar16 < 0) {
LAB_00625325:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar8->pArray[uVar12];
      pAVar7 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 0x18) = pAVar7;
      uVar12 = uVar12 + 1;
      pVVar8 = pAig->vCis;
    } while ((int)uVar12 < pVVar8->nSize);
  }
  pVVar8 = pAig->vObjs;
  iVar11 = 0;
  do {
    lVar6 = (long)iVar11;
    if (0 < pVVar8->nSize) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar8->pArray[lVar13];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          uVar12 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                     *(ulong *)((long)__ptr + ((long)*(int *)(uVar12 + 0x24) * 3 + lVar6) * 8));
          }
          uVar12 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                      *(ulong *)((long)__ptr + ((long)*(int *)(uVar12 + 0x24) * 3 + lVar6) * 8));
          }
          pAVar7 = Aig_And(p,pAVar7,pAVar10);
          *(Aig_Obj_t **)((long)__ptr + ((long)*(int *)((long)pvVar2 + 0x24) * 3 + lVar6) * 8) =
               pAVar7;
          pVVar8 = pAig->vObjs;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar8->nSize);
    }
    iVar18 = pAig->nRegs;
    lVar13 = (long)iVar18;
    if (lVar13 < 1) {
      uVar12 = (ulong)(iVar11 + 1);
    }
    else {
      pVVar3 = pAig->vCos;
      uVar17 = (ulong)(uint)(pAig->nObjs[3] - iVar18);
      uVar12 = lVar6 + 1;
      iVar18 = -iVar18;
      do {
        if (((((int)uVar17 < 0) || (pVVar3->nSize <= (int)uVar17)) ||
            (uVar16 = pAig->nObjs[2] + iVar18, (int)uVar16 < 0)) ||
           (pAig->vCis->nSize <= (int)uVar16)) goto LAB_00625325;
        uVar19 = *(ulong *)((long)pVVar3->pArray[uVar17] + 8);
        uVar14 = uVar19 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (ulong)((uint)uVar19 & 1) ^
                   *(ulong *)((long)__ptr + ((long)*(int *)(uVar14 + 0x24) * 3 + lVar6) * 8);
        }
        if (iVar11 != 2) {
          *(ulong *)((long)__ptr +
                    ((long)*(int *)((long)pAig->vCis->pArray[uVar16] + 0x24) * 3 + uVar12) * 8) =
               uVar19;
        }
        uVar17 = uVar17 + 1;
        iVar18 = iVar18 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    iVar11 = (int)uVar12;
    if (iVar11 == 3) {
      iVar11 = vCands->nSize;
      if (0 < iVar11) {
        lVar6 = 0;
        do {
          pvVar2 = vCands->pArray[lVar6];
          if (0 < *(int *)((long)pvVar2 + 4)) {
            lVar13 = 0;
            do {
              uVar12 = *(ulong *)(*(long *)((long)pvVar2 + 8) + lVar13 * 8);
              uVar14 = uVar12 & 0xfffffffffffffffe;
              lVar9 = (long)*(int *)(uVar14 + 0x24);
              uVar17 = *(ulong *)((long)__ptr + lVar9 * 0x18 + 8);
              uVar19 = (ulong)((uint)uVar12 & 1);
              pAVar10 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + lVar9 * 0x18) ^ uVar19);
              pAVar7 = Aig_And(p,pAVar10,(Aig_Obj_t *)(uVar19 ^ 1 ^ uVar17));
              Aig_ObjCreateCo(p,pAVar7);
              p1 = (Aig_Obj_t *)(uVar19 ^ uVar17);
              pAVar7 = Aig_And(p,pAVar10,p1);
              Aig_ObjCreateCo(p,pAVar7);
              uVar12 = *(ulong *)((long)__ptr + (long)*(int *)(uVar14 + 0x24) * 0x18 + 0x10);
              pAVar7 = Aig_And(p,pAVar10,p1);
              pAVar7 = Aig_And(p,pAVar7,(Aig_Obj_t *)(uVar19 ^ 1 ^ uVar12));
              Aig_ObjCreateCo(p,pAVar7);
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)((long)pvVar2 + 4));
            iVar11 = vCands->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar11);
      }
      Aig_ManCleanup(p);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return p;
    }
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter2( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
  int nFrames = 3;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    
    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
	    {
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
	      Aig_ObjCreateCo( pFrames, pMiter );
	    
	    /* need to check p & Xp is satisfiable */
	    /* jlong -- begin */
          {
	      Aig_Obj_t * pMiter2 = Aig_And( pFrames, pFan0, Aig_Not(pFan1));
	      Aig_ObjCreateCo( pFrames, pMiter2 ); 
          }
        /* jlong -- end  */
	    }

	    {			/* jlong -- begin */
	      Aig_Obj_t * pNode2 = pObjMap[nFrames*Aig_ObjId(pObjR)+2];
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan2  = Aig_NotCond( pNode2, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, Aig_And(pFrames, pFan0, pFan1 ), pFan2);
	      Aig_ObjCreateCo( pFrames, pMiter ); /* jlong -- end  */
	    }

        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}